

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

macro_t new_macro(c2m_ctx_t c2m_ctx,token_t id,VARR_token_t *params,VARR_token_t *replacement)

{
  pre_ctx *ppVar1;
  VARR_macro_t *pVVar2;
  macro_t pmVar3;
  int iVar4;
  node_t_conflict el;
  ulong uVar5;
  macro_t *ppmVar6;
  char *extraout_RDX;
  node_t_conflict n;
  c2m_ctx_t c2m_ctx_00;
  size_t sVar7;
  pos_t pVar8;
  macro_t tab_m;
  macro_t local_30;
  
  ppVar1 = c2m_ctx->pre_ctx;
  el = (node_t_conflict)malloc(0x20);
  *(token_t *)el = id;
  el->attr = params;
  (el->op_link).prev = (node_t)replacement;
  *(int *)&(el->op_link).next = 0;
  iVar4 = HTAB_macro_t_do(ppVar1->macro_tab,(macro_t)el,HTAB_FIND,&local_30);
  if (iVar4 != 0) {
    __assert_fail("!HTAB_DO (macro_t, macro_tab, m, HTAB_FIND, tab_m)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x824,"macro_t new_macro(c2m_ctx_t, token_t, VARR_token_t *, VARR_token_t *)");
  }
  ppmVar6 = &local_30;
  n = el;
  HTAB_macro_t_do(ppVar1->macro_tab,(macro_t)el,HTAB_INSERT,ppmVar6);
  pVVar2 = ppVar1->macros;
  c2m_ctx_00 = (c2m_ctx_t)pVVar2->varr;
  if (c2m_ctx_00 != (c2m_ctx_t)0x0) {
    uVar5 = pVVar2->els_num + 1;
    if (pVVar2->size < uVar5) {
      sVar7 = (uVar5 >> 1) + uVar5;
      ppmVar6 = (macro_t *)realloc(c2m_ctx_00,sVar7 * 8);
      pVVar2->varr = ppmVar6;
      pVVar2->size = sVar7;
    }
    pmVar3 = (macro_t)pVVar2->els_num;
    pVVar2->els_num = (size_t)((long)&pmVar3->id + 1);
    pVVar2->varr[(long)pmVar3] = (macro_t)el;
    return pmVar3;
  }
  new_macro_cold_1();
  pVar8 = get_node_pos(c2m_ctx_00,n);
  if (pVar8.lno < 0) {
    pVar8._8_8_ = ppmVar6;
    pVar8.fname = extraout_RDX;
    set_node_pos(c2m_ctx_00,n,pVar8);
  }
  return (macro_t)n;
}

Assistant:

static macro_t new_macro (c2m_ctx_t c2m_ctx, token_t id, VARR (token_t) * params,
                          VARR (token_t) * replacement) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  macro_t tab_m, m = malloc (sizeof (struct macro));

  m->id = id;
  m->params = params;
  m->replacement = replacement;
  m->ignore_p = FALSE;
  assert (!HTAB_DO (macro_t, macro_tab, m, HTAB_FIND, tab_m));
  HTAB_DO (macro_t, macro_tab, m, HTAB_INSERT, tab_m);
  VARR_PUSH (macro_t, macros, m);
  return m;
}